

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_seq_parameter_set_rbsp(sps_t *sps,bs_t *b)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint32_t uVar4;
  uint uVar5;
  long lVar6;
  FILE *pFVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  memset(sps,0,0x1028);
  sps->chroma_format_idc = 1;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u8(b);
  sps->profile_idc = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->profile_idc: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->constraint_set0_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->constraint_set0_flag: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->constraint_set1_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->constraint_set1_flag: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->constraint_set2_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->constraint_set2_flag: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->constraint_set3_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->constraint_set3_flag: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->constraint_set4_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->constraint_set4_flag: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->constraint_set5_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->constraint_set5_flag: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u(b,2);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"reserved_zero_2bits: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u8(b);
  sps->level_idc = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->level_idc: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  sps->seq_parameter_set_id = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->seq_parameter_set_id: %d \n",(ulong)uVar4);
  iVar1 = sps->profile_idc;
  if ((((iVar1 - 0x53U < 0x39) && ((0x188208808020009U >> ((ulong)(iVar1 - 0x53U) & 0x3f) & 1) != 0)
       ) || (iVar1 == 0xf4)) || (iVar1 == 0x2c)) {
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->chroma_format_idc = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->chroma_format_idc: %d \n",(ulong)uVar4);
    if (sps->chroma_format_idc == 3) {
      pFVar7 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar7 = _stdout;
      }
      fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_u1(b);
      sps->residual_colour_transform_flag = uVar4;
      pFVar7 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar7 = _stdout;
      }
      fprintf(pFVar7,"sps->residual_colour_transform_flag: %d \n",(ulong)uVar4);
    }
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->bit_depth_luma_minus8 = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->bit_depth_luma_minus8: %d \n",(ulong)uVar4);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->bit_depth_chroma_minus8 = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->bit_depth_chroma_minus8: %d \n",(ulong)uVar4);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u1(b);
    sps->qpprime_y_zero_transform_bypass_flag = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->qpprime_y_zero_transform_bypass_flag: %d \n",(ulong)uVar4);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u1(b);
    sps->seq_scaling_matrix_present_flag = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->seq_scaling_matrix_present_flag: %d \n",(ulong)uVar4);
    if (sps->seq_scaling_matrix_present_flag != 0) {
      lVar9 = 0x7f0;
      lVar10 = -0x3f8;
      lVar11 = 0x1f0;
      uVar8 = 0;
      for (lVar6 = 0x70; lVar6 != 0x270; lVar6 = lVar6 + 0x40) {
        pFVar7 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar7 = _stdout;
        }
        fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar4 = bs_read_u1(b);
        sps->seq_scaling_list_present_flag[uVar8] = uVar4;
        pFVar7 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar7 = _stdout;
        }
        fprintf(pFVar7,"sps->seq_scaling_list_present_flag[ i ]: %d \n",(ulong)uVar4);
        if (sps->seq_scaling_list_present_flag[uVar8] != 0) {
          if (uVar8 < 6) {
            iVar1 = 0x10;
            lVar2 = lVar11;
            lVar3 = lVar6;
          }
          else {
            iVar1 = 0x40;
            lVar2 = lVar9;
            lVar3 = lVar10;
          }
          read_debug_scaling_list
                    (b,(int *)((long)sps->seq_scaling_list_present_flag + lVar3 + -0x40),iVar1,
                     (int *)((long)sps->seq_scaling_list_present_flag + lVar2 + -0x40));
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 4;
        lVar10 = lVar10 + 0x100;
        lVar11 = lVar11 + 4;
      }
    }
  }
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  sps->log2_max_frame_num_minus4 = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->log2_max_frame_num_minus4: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  sps->pic_order_cnt_type = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->pic_order_cnt_type: %d \n",(ulong)uVar4);
  if (sps->pic_order_cnt_type == 1) {
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    lVar6 = 0;
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u1(b);
    sps->delta_pic_order_always_zero_flag = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->delta_pic_order_always_zero_flag: %d \n",(ulong)uVar4);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar5 = bs_read_se(b);
    sps->offset_for_non_ref_pic = uVar5;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->offset_for_non_ref_pic: %d \n",(ulong)uVar5);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar5 = bs_read_se(b);
    sps->offset_for_top_to_bottom_field = uVar5;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->offset_for_top_to_bottom_field: %d \n",(ulong)uVar5);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->num_ref_frames_in_pic_order_cnt_cycle = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->num_ref_frames_in_pic_order_cnt_cycle: %d \n",(ulong)uVar4);
    for (; lVar6 < sps->num_ref_frames_in_pic_order_cnt_cycle; lVar6 = lVar6 + 1) {
      pFVar7 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar7 = _stdout;
      }
      fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar5 = bs_read_se(b);
      sps->offset_for_ref_frame[lVar6] = uVar5;
      pFVar7 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar7 = _stdout;
      }
      fprintf(pFVar7,"sps->offset_for_ref_frame[ i ]: %d \n",(ulong)uVar5);
    }
  }
  else if (sps->pic_order_cnt_type == 0) {
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->log2_max_pic_order_cnt_lsb_minus4 = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->log2_max_pic_order_cnt_lsb_minus4: %d \n",(ulong)uVar4);
  }
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  sps->num_ref_frames = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->num_ref_frames: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->gaps_in_frame_num_value_allowed_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->gaps_in_frame_num_value_allowed_flag: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  sps->pic_width_in_mbs_minus1 = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->pic_width_in_mbs_minus1: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  sps->pic_height_in_map_units_minus1 = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->pic_height_in_map_units_minus1: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->frame_mbs_only_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->frame_mbs_only_flag: %d \n",(ulong)uVar4);
  if (sps->frame_mbs_only_flag == 0) {
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u1(b);
    sps->mb_adaptive_frame_field_flag = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->mb_adaptive_frame_field_flag: %d \n",(ulong)uVar4);
  }
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->direct_8x8_inference_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->direct_8x8_inference_flag: %d \n",(ulong)uVar4);
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->frame_cropping_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->frame_cropping_flag: %d \n",(ulong)uVar4);
  if (sps->frame_cropping_flag != 0) {
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->frame_crop_left_offset = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->frame_crop_left_offset: %d \n",(ulong)uVar4);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->frame_crop_right_offset = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->frame_crop_right_offset: %d \n",(ulong)uVar4);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->frame_crop_top_offset = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->frame_crop_top_offset: %d \n",(ulong)uVar4);
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    sps->frame_crop_bottom_offset = uVar4;
    pFVar7 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    fprintf(pFVar7,"sps->frame_crop_bottom_offset: %d \n",(ulong)uVar4);
  }
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u1(b);
  sps->vui_parameters_present_flag = uVar4;
  pFVar7 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar7 = _stdout;
  }
  fprintf(pFVar7,"sps->vui_parameters_present_flag: %d \n",(ulong)uVar4);
  if (sps->vui_parameters_present_flag != 0) {
    read_debug_vui_parameters(sps,b);
    return;
  }
  return;
}

Assistant:

void read_debug_seq_parameter_set_rbsp(sps_t* sps, bs_t* b)
{
    int i;

    if( 1 )
    {
        memset(sps, 0, sizeof(sps_t));
        sps->chroma_format_idc = 1; 
    }
 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->profile_idc = bs_read_u8(b); printf("sps->profile_idc: %d \n", sps->profile_idc); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set0_flag = bs_read_u1(b); printf("sps->constraint_set0_flag: %d \n", sps->constraint_set0_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set1_flag = bs_read_u1(b); printf("sps->constraint_set1_flag: %d \n", sps->constraint_set1_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set2_flag = bs_read_u1(b); printf("sps->constraint_set2_flag: %d \n", sps->constraint_set2_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set3_flag = bs_read_u1(b); printf("sps->constraint_set3_flag: %d \n", sps->constraint_set3_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set4_flag = bs_read_u1(b); printf("sps->constraint_set4_flag: %d \n", sps->constraint_set4_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->constraint_set5_flag = bs_read_u1(b); printf("sps->constraint_set5_flag: %d \n", sps->constraint_set5_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); int reserved_zero_2bits = bs_read_u(b, 2); printf("reserved_zero_2bits: %d \n", reserved_zero_2bits); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->level_idc = bs_read_u8(b); printf("sps->level_idc: %d \n", sps->level_idc); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_parameter_set_id = bs_read_ue(b); printf("sps->seq_parameter_set_id: %d \n", sps->seq_parameter_set_id); 

    if( sps->profile_idc == 100 || sps->profile_idc == 110 ||
        sps->profile_idc == 122 || sps->profile_idc == 244 ||
        sps->profile_idc == 44 || sps->profile_idc == 83 ||
        sps->profile_idc == 86 || sps->profile_idc == 118 ||
        sps->profile_idc == 128 || sps->profile_idc == 138 ||
        sps->profile_idc == 139 || sps->profile_idc == 134
       )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->chroma_format_idc = bs_read_ue(b); printf("sps->chroma_format_idc: %d \n", sps->chroma_format_idc); 
        if( sps->chroma_format_idc == 3 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->residual_colour_transform_flag = bs_read_u1(b); printf("sps->residual_colour_transform_flag: %d \n", sps->residual_colour_transform_flag); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->bit_depth_luma_minus8 = bs_read_ue(b); printf("sps->bit_depth_luma_minus8: %d \n", sps->bit_depth_luma_minus8); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->bit_depth_chroma_minus8 = bs_read_ue(b); printf("sps->bit_depth_chroma_minus8: %d \n", sps->bit_depth_chroma_minus8); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->qpprime_y_zero_transform_bypass_flag = bs_read_u1(b); printf("sps->qpprime_y_zero_transform_bypass_flag: %d \n", sps->qpprime_y_zero_transform_bypass_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_scaling_matrix_present_flag = bs_read_u1(b); printf("sps->seq_scaling_matrix_present_flag: %d \n", sps->seq_scaling_matrix_present_flag); 
        if( sps->seq_scaling_matrix_present_flag )
        {
            for( i = 0; i < 8; i++ )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->seq_scaling_list_present_flag[ i ] = bs_read_u1(b); printf("sps->seq_scaling_list_present_flag[ i ]: %d \n", sps->seq_scaling_list_present_flag[ i ]); 
                if( sps->seq_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_debug_scaling_list( b, sps->ScalingList4x4[ i ], 16,
                                                 &( sps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_debug_scaling_list( b, sps->ScalingList8x8[ i - 6 ], 64,
                                                 &( sps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->log2_max_frame_num_minus4 = bs_read_ue(b); printf("sps->log2_max_frame_num_minus4: %d \n", sps->log2_max_frame_num_minus4); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_order_cnt_type = bs_read_ue(b); printf("sps->pic_order_cnt_type: %d \n", sps->pic_order_cnt_type); 
    if( sps->pic_order_cnt_type == 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b); printf("sps->log2_max_pic_order_cnt_lsb_minus4: %d \n", sps->log2_max_pic_order_cnt_lsb_minus4); 
    }
    else if( sps->pic_order_cnt_type == 1 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->delta_pic_order_always_zero_flag = bs_read_u1(b); printf("sps->delta_pic_order_always_zero_flag: %d \n", sps->delta_pic_order_always_zero_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_non_ref_pic = bs_read_se(b); printf("sps->offset_for_non_ref_pic: %d \n", sps->offset_for_non_ref_pic); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_top_to_bottom_field = bs_read_se(b); printf("sps->offset_for_top_to_bottom_field: %d \n", sps->offset_for_top_to_bottom_field); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->num_ref_frames_in_pic_order_cnt_cycle = bs_read_ue(b); printf("sps->num_ref_frames_in_pic_order_cnt_cycle: %d \n", sps->num_ref_frames_in_pic_order_cnt_cycle); 
        for( i = 0; i < sps->num_ref_frames_in_pic_order_cnt_cycle; i++ )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->offset_for_ref_frame[ i ] = bs_read_se(b); printf("sps->offset_for_ref_frame[ i ]: %d \n", sps->offset_for_ref_frame[ i ]); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->num_ref_frames = bs_read_ue(b); printf("sps->num_ref_frames: %d \n", sps->num_ref_frames); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->gaps_in_frame_num_value_allowed_flag = bs_read_u1(b); printf("sps->gaps_in_frame_num_value_allowed_flag: %d \n", sps->gaps_in_frame_num_value_allowed_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_width_in_mbs_minus1 = bs_read_ue(b); printf("sps->pic_width_in_mbs_minus1: %d \n", sps->pic_width_in_mbs_minus1); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->pic_height_in_map_units_minus1 = bs_read_ue(b); printf("sps->pic_height_in_map_units_minus1: %d \n", sps->pic_height_in_map_units_minus1); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_mbs_only_flag = bs_read_u1(b); printf("sps->frame_mbs_only_flag: %d \n", sps->frame_mbs_only_flag); 
    if( !sps->frame_mbs_only_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->mb_adaptive_frame_field_flag = bs_read_u1(b); printf("sps->mb_adaptive_frame_field_flag: %d \n", sps->mb_adaptive_frame_field_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->direct_8x8_inference_flag = bs_read_u1(b); printf("sps->direct_8x8_inference_flag: %d \n", sps->direct_8x8_inference_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_cropping_flag = bs_read_u1(b); printf("sps->frame_cropping_flag: %d \n", sps->frame_cropping_flag); 
    if( sps->frame_cropping_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_left_offset = bs_read_ue(b); printf("sps->frame_crop_left_offset: %d \n", sps->frame_crop_left_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_right_offset = bs_read_ue(b); printf("sps->frame_crop_right_offset: %d \n", sps->frame_crop_right_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_top_offset = bs_read_ue(b); printf("sps->frame_crop_top_offset: %d \n", sps->frame_crop_top_offset); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->frame_crop_bottom_offset = bs_read_ue(b); printf("sps->frame_crop_bottom_offset: %d \n", sps->frame_crop_bottom_offset); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui_parameters_present_flag = bs_read_u1(b); printf("sps->vui_parameters_present_flag: %d \n", sps->vui_parameters_present_flag); 
    if( sps->vui_parameters_present_flag )
    {
        read_debug_vui_parameters(sps, b);
    }
}